

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

size_t EmitArgsWithArgOutsAtEnd
                 (ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
                 FuncInfo *funcInfo,ProfileId callSiteId,RegSlot thisLocation,
                 ArgSlot argsCountForStartCall,bool emitProfiledArgouts,
                 AuxArray<unsigned_int> *spreadIndices)

{
  OpCode OVar1;
  code *pcVar2;
  ArgSlot AVar3;
  bool bVar4;
  RegSlot RVar5;
  RegSlot argTempLocation;
  undefined4 *puVar6;
  ParseNodeBin *pPVar7;
  RegSlot reg;
  ArgSlot index;
  ushort uVar8;
  uint uVar9;
  ByteCodeWriter *this;
  ulong uVar11;
  ArgSlot local_34;
  ArgSlot local_32 [3];
  ArgSlot spreadIndex;
  ArgSlot argIndex;
  uint uVar10;
  
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d3a,"(pnode != nullptr)","pnode != nullptr");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  local_32[0] = 0;
  local_34 = 0;
  RVar5 = FuncInfo::AcquireTmpRegister(funcInfo);
  OVar1 = pnode->nop;
  argTempLocation = RVar5;
  while (OVar1 == knopList) {
    pPVar7 = ParseNode::AsParseNodeBin(pnode);
    EmitOneArg(pPVar7->pnode1,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,local_32,&local_34,
               argTempLocation,false,spreadIndices);
    pPVar7 = ParseNode::AsParseNodeBin(pnode);
    pnode = pPVar7->pnode2;
    argTempLocation = FuncInfo::AcquireTmpRegister(funcInfo);
    OVar1 = pnode->nop;
  }
  EmitOneArg(pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,local_32,&local_34,
             argTempLocation,false,spreadIndices);
  this = &byteCodeGenerator->m_writer;
  Js::ByteCodeWriter::StartCall(this,StartCall,argsCountForStartCall);
  if (thisLocation != 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>(this,0,thisLocation,callSiteId,false);
  }
  AVar3 = local_32[0];
  uVar11 = (ulong)local_32[0];
  if (local_32[0] != 0) {
    uVar9 = 0;
    do {
      reg = RVar5 + uVar9;
      uVar9 = uVar9 + 1;
      Js::ByteCodeWriter::ArgOut<true>(this,(ArgSlot)uVar9,reg,callSiteId,emitProfiledArgouts);
      uVar10 = (uint)AVar3;
    } while (uVar10 != uVar9);
    do {
      FuncInfo::ReleaseTmpRegister(funcInfo,argTempLocation);
      uVar8 = (short)uVar10 - 1;
      uVar10 = (uint)uVar8;
      argTempLocation = argTempLocation - 1;
    } while (uVar8 != 0);
  }
  return uVar11;
}

Assistant:

size_t EmitArgsWithArgOutsAtEnd(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::RegSlot thisLocation,
    Js::ArgSlot argsCountForStartCall,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
)
{
    AssertOrFailFast(pnode != nullptr);

    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    Js::RegSlot argTempLocation = funcInfo->AcquireTmpRegister();
    Js::RegSlot firstArgTempLocation = argTempLocation;

    while (pnode->nop == knopList)
    {
        EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);
        pnode = pnode->AsParseNodeBin()->pnode2;
        argTempLocation = funcInfo->AcquireTmpRegister();
    }

    EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argsCountForStartCall);

    // Emit all argOuts now

    if (thisLocation != Js::Constants::NoRegister)
    {
        // Emit the "this" object.
        byteCodeGenerator->Writer()->ArgOut<true>(0, thisLocation, callSiteId, false /*emitProfiledArgouts*/);
    }

    for (Js::ArgSlot index = 0; index < argIndex; index++)
    {
        byteCodeGenerator->Writer()->ArgOut<true>(index + 1, firstArgTempLocation + index, callSiteId, emitProfiledArgouts);
    }

    // Now release all those temps register
    for (Js::ArgSlot index = argIndex; index > 0; index--)
    {
        funcInfo->ReleaseTmpRegister(argTempLocation--);
    }

    return argIndex;
}